

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  bool bVar1;
  char cVar2;
  _Alloc_hider _Var3;
  String local_40;
  
  bVar1 = Value::hasComment(root,commentBefore);
  if (bVar1) {
    cVar2 = (char)this + ' ';
    std::__cxx11::string::push_back(cVar2);
    writeIndent(this);
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    _Var3._M_p = local_40._M_dataplus._M_p;
    if (local_40._M_string_length != 0) {
      do {
        std::__cxx11::string::push_back(cVar2);
        if (((*_Var3._M_p == '\n') &&
            (_Var3._M_p + 1 != local_40._M_dataplus._M_p + local_40._M_string_length)) &&
           (_Var3._M_p[1] == '/')) {
          writeIndent(this);
        }
        _Var3._M_p = _Var3._M_p + 1;
      } while (_Var3._M_p != local_40._M_dataplus._M_p + local_40._M_string_length);
    }
    std::__cxx11::string::push_back(cVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void StyledWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  document_ += '\n';
  writeIndent();
  const String& comment = root.getComment(commentBefore);
  String::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    document_ += *iter;
    if (*iter == '\n' && ((iter + 1) != comment.end() && *(iter + 1) == '/'))
      writeIndent();
    ++iter;
  }

  // Comments are stripped of trailing newlines, so add one here
  document_ += '\n';
}